

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShowLabel::dragEnterEvent(QColorShowLabel *this,QDragEnterEvent *e)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  long in_FS_OFFSET;
  QMetaType local_60;
  QMetaType local_58;
  int iStack_50;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  anon_union_24_3_e3d07ef4_for_data local_40;
  byte local_28;
  undefined7 uStack_27;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar6 = &local_40;
  QMimeData::colorData();
  local_60.d_ptr = &QMetaTypeInterfaceWrapper<QColor>::metaType;
  uVar4 = CONCAT71(uStack_27,local_28) & 0xfffffffffffffffc;
  local_58.d_ptr._0_4_ = (int)uVar4;
  local_58.d_ptr._4_2_ = (undefined2)(uVar4 >> 0x20);
  local_58.d_ptr._6_2_ = (undefined2)(uVar4 >> 0x30);
  bVar3 = comparesEqual(&local_58,&local_60);
  if (bVar3) {
    if ((local_28 & 1) != 0) {
      piVar1 = (int *)(CONCAT44(local_40._4_4_,local_40._0_4_) +
                      (long)*(int *)(CONCAT44(local_40._4_4_,local_40._0_4_) + 4));
      local_40._0_4_ = *piVar1;
      local_40._4_4_ = piVar1[1];
      local_40._8_4_ = piVar1[2];
      local_40._12_4_ = piVar1[3];
    }
    local_58.d_ptr._4_2_ = (undefined2)local_40._4_4_;
    local_58.d_ptr._6_2_ = (undefined2)((uint)local_40._4_4_ >> 0x10);
    uStack_4c = (undefined2)local_40._12_4_;
    uStack_4a = (undefined2)((uint)local_40._12_4_ >> 0x10);
    local_58.d_ptr._0_4_ = local_40._0_4_;
    iStack_50 = local_40._8_4_;
  }
  else {
    uStack_4a = 0xaaaa;
    local_58.d_ptr._0_4_ = 0;
    local_58.d_ptr._4_2_ = 0xffff;
    local_58.d_ptr._6_2_ = 0;
    iStack_50 = 0;
    uStack_4c = 0;
    QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_28 & 1) != 0) {
      paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
               ((long)*(int *)(CONCAT44(local_40._4_4_,local_40._0_4_) + 4) +
               CONCAT44(local_40._4_4_,local_40._0_4_));
    }
    QMetaType::convert(QVar5,paVar6,local_60,&local_58);
  }
  iVar2 = (int)local_58.d_ptr;
  ::QVariant::~QVariant((QVariant *)&local_40);
  e[0xc] = (QDragEnterEvent)(iVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorShowLabel::dragEnterEvent(QDragEnterEvent *e)
{
    if (qvariant_cast<QColor>(e->mimeData()->colorData()).isValid())
        e->accept();
    else
        e->ignore();
}